

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O1

void configure_char_sheet(void)

{
  int iVar1;
  char_sheet_config *pcVar2;
  wchar_t wVar3;
  ui_entry_iterator *puVar4;
  ui_entry **ppuVar5;
  ui_entry *puVar6;
  char_sheet_resist *pcVar7;
  long lVar8;
  long lVar9;
  wchar_t wVar10;
  ulong uVar11;
  char *test_categories [2];
  char *local_48;
  char *local_40;
  
  release_char_sheet_config();
  cached_config = (char_sheet_config *)mem_alloc(0x88);
  local_48 = "CHAR_SCREEN1";
  local_40 = "stat_modifiers";
  puVar4 = initialize_ui_entry_iterator(check_for_two_categories,&local_48,"stat_modifiers");
  wVar3 = count_ui_entry_iterator(puVar4);
  wVar10 = L'\x05';
  if (wVar3 < L'\x05') {
    wVar10 = wVar3;
  }
  cached_config->n_stat_mod_entries = wVar10;
  ppuVar5 = (ui_entry **)mem_alloc((long)wVar10 << 3);
  cached_config->stat_mod_entries = ppuVar5;
  if (L'\0' < wVar3) {
    uVar11 = 0;
    do {
      puVar6 = advance_ui_entry_iterator(puVar4);
      cached_config->stat_mod_entries[uVar11] = puVar6;
      uVar11 = uVar11 + 1;
    } while ((uint)wVar10 != uVar11);
  }
  release_ui_entry_iterator(puVar4);
  pcVar2 = cached_config;
  cached_config->res_nlabel = L'\x06';
  pcVar2->res_cols = (uint)(player->body).count + L'\a';
  pcVar2->res_rows = L'\0';
  lVar9 = 0;
  do {
    pcVar2 = cached_config;
    wVar10 = cached_config->res_cols;
    cached_config->res_regions[lVar9].col = (int)lVar9 * (wVar10 + L'\x01');
    pcVar2->res_regions[lVar9].row = 7;
    pcVar2->res_regions[lVar9].width = wVar10;
    local_40 = (&PTR_anon_var_dwarf_1687d9_002d0ae0)[lVar9];
    puVar4 = initialize_ui_entry_iterator(check_for_two_categories,&local_48,local_40);
    wVar3 = count_ui_entry_iterator(puVar4);
    iVar1 = cached_config->res_regions[lVar9].row;
    wVar10 = L'\x14' - iVar1;
    if (wVar3 + iVar1 + 2 < 0x17) {
      wVar10 = wVar3;
    }
    cached_config->n_resist_by_region[lVar9] = wVar10;
    pcVar7 = (char_sheet_resist *)mem_alloc((long)wVar10 << 5);
    cached_config->resists_by_region[lVar9] = pcVar7;
    if (L'\0' < wVar10) {
      lVar8 = 0x1c;
      uVar11 = 0;
      do {
        puVar6 = advance_ui_entry_iterator(puVar4);
        pcVar2 = cached_config;
        *(ui_entry **)((long)cached_config->resists_by_region[lVar9]->label + lVar8 + -0x24) =
             puVar6;
        get_ui_entry_label(puVar6,pcVar2->res_nlabel,true,
                           (wchar_t *)
                           ((long)pcVar2->resists_by_region[lVar9]->label + lVar8 + -0x1c));
        text_mbstowcs((wchar_t *)((long)cached_config->resists_by_region[lVar9]->label + lVar8 + -8)
                      ,":",L'\x01');
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar11 < (uint)wVar10);
    }
    release_ui_entry_iterator(puVar4);
    if (cached_config->res_rows < cached_config->n_resist_by_region[lVar9]) {
      cached_config->res_rows = cached_config->n_resist_by_region[lVar9];
    }
    pcVar2 = cached_config;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  wVar10 = cached_config->res_rows;
  lVar9 = 0;
  do {
    *(wchar_t *)((long)&pcVar2->res_regions[0].page_rows + lVar9) = wVar10 + L'\x02';
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  return;
}

Assistant:

static void configure_char_sheet(void)
{
	const char* region_categories[] = {
		"resistances",
		"abilities",
		"hindrances",
		"modifiers"
	};
	const char* test_categories[2];
	struct ui_entry_iterator* ui_iter;
	int i, n;

	release_char_sheet_config();

	cached_config = mem_alloc(sizeof(*cached_config));

	test_categories[0] = "CHAR_SCREEN1";
	test_categories[1] = "stat_modifiers";
	ui_iter = initialize_ui_entry_iterator(check_for_two_categories,
		test_categories, test_categories[1]);
	n = count_ui_entry_iterator(ui_iter);
	/*
	 * Linked to hardcoded stats display with STAT_MAX entries so only use
	 * that many.
	 */
	if (n > STAT_MAX) {
	    n = STAT_MAX;
	}
	cached_config->n_stat_mod_entries = n;
	cached_config->stat_mod_entries = mem_alloc(n *
		sizeof(*cached_config->stat_mod_entries));
	for (i = 0; i < n; ++i) {
		cached_config->stat_mod_entries[i] =
			advance_ui_entry_iterator(ui_iter);
	}
	release_ui_entry_iterator(ui_iter);

	cached_config->res_nlabel = 6;
	cached_config->res_cols =
		cached_config->res_nlabel + 1 + player->body.count;
	cached_config->res_rows = 0;
	for (i = 0; i < 4; ++i) {
		int j;

		cached_config->res_regions[i].col =
			i * (cached_config->res_cols + 1);
		cached_config->res_regions[i].row = 2 + STAT_MAX;
		cached_config->res_regions[i].width = cached_config->res_cols;

		test_categories[1] = region_categories[i];
		ui_iter = initialize_ui_entry_iterator(check_for_two_categories, test_categories, region_categories[i]);
		n = count_ui_entry_iterator(ui_iter);
		/*
		 * Fit in 24 row display; leave at least one row blank before
		 * prompt on last row.
		 */
		if (n + 2 + cached_config->res_regions[i].row > 22) {
		    n = 20 - cached_config->res_regions[i].row;
		}
		cached_config->n_resist_by_region[i] = n;
		cached_config->resists_by_region[i] = mem_alloc(n * sizeof(*cached_config->resists_by_region[i]));
		for (j = 0; j < n; ++j) {
			struct ui_entry *entry = advance_ui_entry_iterator(ui_iter);

			cached_config->resists_by_region[i][j].entry = entry;
			get_ui_entry_label(entry, cached_config->res_nlabel, true, cached_config->resists_by_region[i][j].label);
			(void) text_mbstowcs(cached_config->resists_by_region[i][j].label + 5, ":", 1);
		}
		release_ui_entry_iterator(ui_iter);

		if (cached_config->res_rows <
			cached_config->n_resist_by_region[i]) {
			cached_config->res_rows =
				cached_config->n_resist_by_region[i];
		}
	}
	for (i = 0; i < 4; ++i) {
		cached_config->res_regions[i].page_rows =
			cached_config->res_rows + 2;
	}
}